

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantum.cpp
# Opt level: O0

void __thiscall quantum::QuantumComputer::viewProbabilityForBaseVector(QuantumComputer *this)

{
  bool bVar1;
  reference pdVar2;
  double x;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  QuantumComputer *this_local;
  
  std::operator<<((ostream *)&std::cout,"\nVector with probability {");
  __end1 = std::vector<double,_std::allocator<double>_>::begin(&this->baseVector);
  x = (double)std::vector<double,_std::allocator<double>_>::end(&this->baseVector);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&x);
    if (!bVar1) break;
    pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1);
    pow(ABS(*pdVar2),2.0);
    printf("[%.4f]");
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  std::operator<<((ostream *)&std::cout,"}\n");
  return;
}

Assistant:

void quantum::QuantumComputer::viewProbabilityForBaseVector(){
    std::cout << "\nVector with probability {";
    for (auto x: this->baseVector) {
        printf("[%.4f]", pow(fabs(x), 2));
    }
    std::cout << "}\n";
}